

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDataBase<QSharedPointer<Data>,_void_(const_QSharedPointer<Data>_&)>::
~PromiseDataBase(PromiseDataBase<QSharedPointer<Data>,_void_(const_QSharedPointer<Data>_&)> *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }